

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O0

int16_list * ntru_ring_invert_wrapper(int16_list *in,uint p,uint q)

{
  uint uVar1;
  uint success;
  int16_list *out;
  uint q_local;
  uint p_local;
  int16_list *in_local;
  
  int16_list_resize(in,p);
  in_local = make_int16_list((ulong)p);
  uVar1 = ntru_ring_invert(in_local->integers,in->integers,p,q);
  if (uVar1 == 0) {
    in_local = (int16_list *)0x0;
  }
  return in_local;
}

Assistant:

int16_list *ntru_ring_invert_wrapper(int16_list *in, unsigned p, unsigned q)
{
    int16_list_resize(in, p);
    int16_list *out = make_int16_list(p);
    unsigned success = ntru_ring_invert(out->integers, in->integers, p, q);
    if (!success)
        return NULL;
    return out;
}